

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  string_view arg;
  cmValue __s;
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  long lVar4;
  string *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  PolicyID id;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  string_view local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  undefined1 local_118 [8];
  string ndefs;
  iterator defBegin;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  defEnd;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defs;
  string local_a8;
  cmValue local_88;
  cmValue cdefs;
  char *define;
  string local_58;
  byte local_21;
  string *psStack_20;
  bool remove_local;
  string *def_local;
  cmMakefile *this_local;
  
  local_21 = remove;
  psStack_20 = def;
  def_local = (string *)this;
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  bVar1 = cmsys::RegularExpression::find(&ParseDefineFlag::valid,psStack_20);
  if (!bVar1) {
    return false;
  }
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
     iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                 &__dso_handle);
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
  }
  bVar1 = cmsys::RegularExpression::find(&ParseDefineFlag::trivial,psStack_20);
  if (bVar1) goto switchD_00327d2b_default;
  PVar3 = GetPolicyStatus(this,CMP0005,false);
  switch(PVar3) {
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_58,(cmPolicies *)0x5,id);
    IssueMessage(this,AUTHOR_WARNING,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  case OLD:
    this_local._7_1_ = false;
    break;
  case NEW:
  default:
switchD_00327d2b_default:
    lVar4 = std::__cxx11::string::c_str();
    cdefs.Value = (string *)(lVar4 + 2);
    if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"COMPILE_DEFINITIONS",&local_191);
      __s = cdefs;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,(char *)__s.Value,&local_1b9);
      AppendProperty(this,&local_190,&local_1b8,false);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"COMPILE_DEFINITIONS",
                 (allocator<char> *)
                 ((long)&defs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_88 = GetProperty(this,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&defs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_88);
      if (bVar1) {
        this_00 = cmValue::operator*[abi_cxx11_(&local_88);
        arg = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c8,arg,false);
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_c8);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_c8);
        end = std::
              remove<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                        (__first._M_current,__last._M_current,(char **)&cdefs);
        local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_c8);
        local_138 = end._M_current;
        ndefs.field_2._8_8_ = local_130;
        local_128 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_130,end);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,";");
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((string *)local_118,&local_128,local_148);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"COMPILE_DEFINITIONS",&local_169);
        SetProperty(this,&local_168,(string *)local_118);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
        std::__cxx11::string::~string((string *)local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
      }
    }
    this_local._7_1_ = true;
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&define,(cmPolicies *)0x5,id);
    IssueMessage(this,FATAL_ERROR,(string *)&define);
    std::__cxx11::string::~string((string *)&define);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if (!valid.find(def)) {
    return false;
  }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression trivial(
    "^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if (!trivial.find(def)) {
    // This definition has a non-trivial value.
    switch (this->GetPolicyStatus(cmPolicies::CMP0005)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0005));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005));
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
    }
  }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if (remove) {
    if (cmValue cdefs = this->GetProperty("COMPILE_DEFINITIONS")) {
      // Expand the list.
      std::vector<std::string> defs = cmExpandedList(*cdefs);

      // Recompose the list without the definition.
      auto defEnd = std::remove(defs.begin(), defs.end(), define);
      auto defBegin = defs.begin();
      std::string ndefs = cmJoin(cmMakeRange(defBegin, defEnd), ";");

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", ndefs);
    }
  } else {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
  }

  return true;
}